

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O0

void __thiscall cfdcapi_coin_EstimateFeeTest_Test::TestBody(cfdcapi_coin_EstimateFeeTest_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  char *pcVar2;
  Script *expected_predicate_value;
  Amount AVar3;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *str_buffer;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int64_t utxo_fee;
  int64_t tx_fee;
  AssertionResult gtest_ar_2;
  UtxoData *utxo;
  iterator __end2;
  iterator __begin2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2;
  AssertionResult gtest_ar_1;
  void *fee_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  AddressFactory factory;
  Script *this_00;
  string *in_stack_ffffffffffffe600;
  string *address_string;
  UtxoData *this_01;
  AddressFactory *in_stack_ffffffffffffe608;
  AddressFactory *this_02;
  string *lhs;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_03;
  undefined8 in_stack_ffffffffffffe618;
  uint uVar4;
  void **handle_00;
  ConfidentialAssetId *__a;
  ElementsConfidentialAddress *this_04;
  undefined5 uVar5;
  undefined1 is_pegin;
  undefined1 is_blind_issuance;
  undefined1 is_issuance;
  BlindFactor *asset;
  ConfidentialValue *descriptor;
  Script *pSVar6;
  char *in_stack_ffffffffffffe658;
  undefined4 in_stack_ffffffffffffe660;
  undefined4 in_stack_ffffffffffffe664;
  Script *in_stack_ffffffffffffe668;
  undefined4 in_stack_ffffffffffffe670;
  uint32_t in_stack_ffffffffffffe674;
  Txid *in_stack_ffffffffffffe678;
  undefined7 in_stack_ffffffffffffe680;
  undefined1 in_stack_ffffffffffffe687;
  undefined4 in_stack_ffffffffffffe688;
  undefined4 in_stack_ffffffffffffe68c;
  UtxoData *in_stack_ffffffffffffe690;
  undefined4 in_stack_ffffffffffffe698;
  int in_stack_ffffffffffffe69c;
  Script *in_stack_ffffffffffffe6a0;
  uint32_t in_stack_ffffffffffffe6a8;
  undefined4 in_stack_ffffffffffffe6ac;
  string *in_stack_ffffffffffffe6b0;
  undefined7 in_stack_ffffffffffffe6b8;
  undefined1 in_stack_ffffffffffffe6bf;
  AddressType in_stack_ffffffffffffe6c0;
  undefined4 in_stack_ffffffffffffe6c8;
  undefined4 in_stack_ffffffffffffe6cc;
  undefined1 is_elements;
  ConfidentialAssetId *in_stack_ffffffffffffe6d0;
  undefined7 in_stack_ffffffffffffe6d8;
  undefined1 in_stack_ffffffffffffe6df;
  BlindFactor *in_stack_ffffffffffffe6e0;
  undefined4 in_stack_ffffffffffffe6e8;
  undefined4 in_stack_ffffffffffffe6ec;
  ConfidentialValue *in_stack_ffffffffffffe6f0;
  Script *in_stack_ffffffffffffe6f8;
  undefined1 ***local_18a0;
  AssertHelper local_17f8;
  Message local_17f0;
  undefined4 local_17e4;
  AssertionResult local_17e0;
  AssertHelper local_17d0;
  Message local_17c8;
  AssertionResult local_17c0;
  AssertHelper local_17b0;
  Message local_17a8;
  undefined4 local_179c;
  AssertionResult local_1798;
  char *local_1788;
  AssertHelper local_1780;
  Message local_1778;
  undefined4 local_176c;
  AssertionResult local_1768;
  AssertHelper local_1758;
  Message local_1750;
  undefined8 local_1748;
  AssertionResult local_1740;
  AssertHelper in_stack_ffffffffffffe8d0;
  undefined1 in_stack_ffffffffffffe8df;
  int64_t *in_stack_ffffffffffffe8e0;
  int64_t *in_stack_ffffffffffffe8e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffe8f0;
  AssertHelper in_stack_ffffffffffffe8f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffe900;
  undefined4 in_stack_ffffffffffffe908;
  undefined4 in_stack_ffffffffffffe90c;
  AssertionResult local_16f0 [2];
  AssertHelper local_16d0;
  Message local_16c8;
  undefined4 local_16bc;
  AssertionResult local_16b8;
  string local_16a8;
  reference local_1688;
  UtxoData *local_1680;
  __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_1678;
  undefined1 *local_1670;
  AssertHelper local_1668;
  Message local_1660;
  undefined4 local_1654;
  AssertionResult local_1650;
  undefined8 local_1640;
  string local_1638;
  AssertHelper local_1618;
  Message local_1610;
  undefined1 local_1601;
  AssertionResult local_1600;
  AssertHelper local_15f0;
  Message local_15e8;
  undefined4 local_15dc;
  AssertionResult local_15d8;
  int local_15c4;
  long local_15c0;
  undefined1 local_15b1;
  Script local_15b0;
  ConfidentialValue local_1578;
  BlindFactor local_1550;
  BlindFactor local_1530;
  ElementsConfidentialAddress local_1510;
  ConfidentialAssetId local_1360;
  pointer local_1338;
  undefined1 local_1330;
  undefined1 local_1328 [24];
  string local_1310 [39];
  allocator local_12e9;
  string local_12e8 [32];
  undefined1 local_12c8 [384];
  string local_1148;
  Script local_1128;
  allocator local_10e9;
  string local_10e8;
  Script local_10c8;
  allocator local_1089;
  string local_1088;
  Txid local_1068;
  allocator local_1041;
  string local_1040;
  BlockHash local_1020;
  Script local_1000;
  ConfidentialValue local_fc8;
  BlindFactor local_fa0;
  BlindFactor local_f80;
  ElementsConfidentialAddress local_f60;
  ConfidentialAssetId local_db0;
  int64_t local_d88;
  undefined1 local_d80;
  int64_t local_d78;
  undefined1 local_d70;
  allocator local_d61;
  undefined1 local_d60 [40];
  string local_d38 [32];
  string local_d18 [11];
  allocator local_b99;
  string local_b98;
  Script local_b78;
  allocator local_b39;
  string local_b38;
  Script local_b18;
  allocator local_ad9;
  string local_ad8;
  Txid local_ab8;
  allocator local_a81;
  string local_a80;
  BlockHash local_a60;
  undefined8 **local_a40;
  undefined1 **local_a38 [158];
  undefined1 local_548 [1264];
  undefined8 **local_58;
  undefined8 local_50;
  undefined1 local_48 [72];
  
  uVar4 = (uint)((ulong)in_stack_ffffffffffffe618 >> 0x20);
  cfd::AddressFactory::AddressFactory((AddressFactory *)0x3062cc);
  local_15b1 = 1;
  local_a40 = local_a38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a80,"590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"
             ,&local_a81);
  cfd::core::BlockHash::BlockHash(&local_a60,&local_a80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ad8,"ffe2f9aa4e2c2adb1676008aa07aec5f64149470abb5d89d91b26dfba14e9318"
             ,&local_ad9);
  cfd::core::Txid::Txid(&local_ab8,&local_ad8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b38,"a914155801788fcd51f57e097a0b6c30f1b69057290d87",&local_b39);
  cfd::core::Script::Script(&local_b18,&local_b38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b98,"001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd",&local_b99);
  cfd::core::Script::Script(&local_b78,&local_b98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d38,"33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k",(allocator *)(local_d60 + 0x27));
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d60,
             "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc"
             ,&local_d61);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(600000000);
  local_d88 = AVar3.amount_;
  local_d80 = AVar3.ignore_check_;
  local_d78 = local_d88;
  local_d70 = local_d80;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_db0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_f60);
  cfd::core::BlindFactor::BlindFactor(&local_f80);
  cfd::core::BlindFactor::BlindFactor(&local_fa0);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_fc8);
  cfd::core::Script::Script(&local_1000);
  this_02 = (AddressFactory *)local_d60;
  address_string = local_d18;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffe690,CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688)
             ,(BlockHash *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,in_stack_ffffffffffffe674,in_stack_ffffffffffffe668,
             in_stack_ffffffffffffe6a0,
             (Address *)CONCAT44(in_stack_ffffffffffffe6ac,in_stack_ffffffffffffe6a8),
             in_stack_ffffffffffffe6b0,
             (Amount *)CONCAT17(in_stack_ffffffffffffe6bf,in_stack_ffffffffffffe6b8),
             in_stack_ffffffffffffe6c0,
             (void *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
             in_stack_ffffffffffffe6d0,
             (ElementsConfidentialAddress *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),in_stack_ffffffffffffe6e0
             ,(BlindFactor *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),
             in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6f8);
  local_a40 = (undefined8 **)local_548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1040,
             "e05419389a3aa71017eb4dd1d9eec73500971b86aab2eb0db116707c7be67996",&local_1041);
  cfd::core::BlockHash::BlockHash(&local_1020,&local_1040);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1088,
             "d68154ae19408850308967b2cb1b84a92166829610fb2321548b655c4a747c79",&local_1089);
  cfd::core::Txid::Txid(&local_1068,&local_1088);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_10e8,"a914155801788fcd51f57e097a0b6c30f1b69057290d87",&local_10e9);
  cfd::core::Script::Script(&local_10c8,&local_10e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1148,"001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd",
             (allocator *)(local_12c8 + 0x17f));
  cfd::core::Script::Script(&local_1128,&local_1148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12e8,"33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k",&local_12e9);
  cfd::AddressFactory::GetAddress(this_02,address_string);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1310,
             "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc"
             ,(allocator *)(local_1328 + 0x17));
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(700000000);
  local_1338 = (pointer)AVar3.amount_;
  local_1330 = AVar3.ignore_check_;
  local_1328._0_8_ = local_1338;
  local_1328[8] = local_1330;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1360);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_1510);
  cfd::core::BlindFactor::BlindFactor(&local_1530);
  cfd::core::BlindFactor::BlindFactor(&local_1550);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1578);
  cfd::core::Script::Script(&local_15b0);
  pSVar6 = &local_15b0;
  descriptor = &local_1578;
  asset = &local_1550;
  uVar5 = SUB85(&local_1530,0);
  is_pegin = (undefined1)((ulong)&local_1530 >> 0x28);
  is_blind_issuance = (undefined1)((ulong)&local_1530 >> 0x30);
  is_issuance = (undefined1)((ulong)&local_1530 >> 0x38);
  this_04 = &local_1510;
  __a = &local_1360;
  this_03 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)local_1328;
  lhs = local_1310;
  this_01 = (UtxoData *)local_12c8;
  this_00 = &local_1128;
  handle_00 = (void **)((ulong)uVar4 << 0x20);
  expected_predicate_value = &local_10c8;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffe690,CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688)
             ,(BlockHash *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,in_stack_ffffffffffffe674,in_stack_ffffffffffffe668,
             in_stack_ffffffffffffe6a0,
             (Address *)CONCAT44(in_stack_ffffffffffffe6ac,in_stack_ffffffffffffe6a8),
             in_stack_ffffffffffffe6b0,
             (Amount *)CONCAT17(in_stack_ffffffffffffe6bf,in_stack_ffffffffffffe6b8),
             in_stack_ffffffffffffe6c0,
             (void *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
             in_stack_ffffffffffffe6d0,
             (ElementsConfidentialAddress *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),in_stack_ffffffffffffe6e0
             ,(BlindFactor *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),
             in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6f8);
  local_15b1 = 0;
  local_58 = local_a38;
  local_50 = 2;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x306971);
  __l._M_array._5_1_ = is_pegin;
  __l._M_array._0_5_ = uVar5;
  __l._M_array._6_1_ = is_blind_issuance;
  __l._M_array._7_1_ = is_issuance;
  __l._M_len = (size_type)asset;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_04,__l,
             (allocator_type *)__a);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x3069a5);
  local_18a0 = (undefined1 ***)&local_58;
  do {
    local_18a0 = local_18a0 + -0x9e;
    cfd::UtxoData::~UtxoData(this_01);
    is_elements = (undefined1)((uint)in_stack_ffffffffffffe6cc >> 0x18);
  } while (local_18a0 != local_a38);
  cfd::core::Script::~Script((Script *)this_01);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x306a16);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x306a23);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x306a30);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x306a4a);
  std::__cxx11::string::~string(local_1310);
  std::allocator<char>::~allocator((allocator<char> *)(local_1328 + 0x17));
  cfd::core::Address::~Address((Address *)this_01);
  std::__cxx11::string::~string(local_12e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12e9);
  cfd::core::Script::~Script((Script *)this_01);
  std::__cxx11::string::~string((string *)&local_1148);
  std::allocator<char>::~allocator((allocator<char> *)(local_12c8 + 0x17f));
  cfd::core::Script::~Script((Script *)this_01);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
  cfd::core::Txid::~Txid((Txid *)0x306ae6);
  std::__cxx11::string::~string((string *)&local_1088);
  std::allocator<char>::~allocator((allocator<char> *)&local_1089);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x306b0d);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  cfd::core::Script::~Script((Script *)this_01);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x306b41);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x306b4e);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x306b5b);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x306b75);
  std::__cxx11::string::~string((string *)local_d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  cfd::core::Address::~Address((Address *)this_01);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator((allocator<char> *)(local_d60 + 0x27));
  cfd::core::Script::~Script((Script *)this_01);
  std::__cxx11::string::~string((string *)&local_b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_b99);
  cfd::core::Script::~Script((Script *)this_01);
  std::__cxx11::string::~string((string *)&local_b38);
  std::allocator<char>::~allocator((allocator<char> *)&local_b39);
  cfd::core::Txid::~Txid((Txid *)0x306c11);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x306c38);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_a81);
  local_15c0 = 0;
  local_15c4 = CfdCreateHandle(handle_00);
  local_15dc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)handle_00,(char *)this_03,(CfdErrorCode *)lhs,(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_15d8);
  if (!bVar1) {
    testing::Message::Message(&local_15e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3073ed);
    testing::internal::AssertHelper::AssertHelper
              (&local_15f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_15f0,&local_15e8);
    testing::internal::AssertHelper::~AssertHelper(&local_15f0);
    testing::Message::~Message((Message *)0x307450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3074a5);
  local_1601 = local_15c0 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)this_00,(type *)0x3074d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1600);
  if (!bVar1) {
    testing::Message::Message(&local_1610);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1638,(internal *)&local_1600,(AssertionResult *)"(NULL == handle)","true",
               "false",(char *)expected_predicate_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1618,&local_1610);
    testing::internal::AssertHelper::~AssertHelper(&local_1618);
    std::__cxx11::string::~string((string *)&local_1638);
    testing::Message::~Message((Message *)0x3075cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30764a);
  local_1640 = 0;
  local_15c4 = CfdInitializeEstimateFee
                         ((void *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
                          &in_stack_ffffffffffffe6d0->_vptr_ConfidentialAssetId,(bool)is_elements);
  local_1654 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)handle_00,(char *)this_03,(CfdErrorCode *)lhs,(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1650);
  if (!bVar1) {
    testing::Message::Message(&local_1660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30772b);
    testing::internal::AssertHelper::AssertHelper
              (&local_1668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1668,&local_1660);
    testing::internal::AssertHelper::~AssertHelper(&local_1668);
    testing::Message::~Message((Message *)0x30778e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3077e6);
  if (local_15c4 == 0) {
    local_1670 = local_48;
    local_1678._M_current =
         (UtxoData *)
         std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                   ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_00);
    local_1680 = (UtxoData *)
                 std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                           ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                               *)this_01,
                              (__normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                               *)this_00), bVar1) {
      local_1688 = __gnu_cxx::
                   __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                   ::operator*(&local_1678);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_16a8,&local_1688->txid);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      handle_00 = (void **)0x0;
      this_03 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                ((ulong)this_03 & 0xffffffff00000000);
      lhs = (string *)((ulong)lhs & 0xffffffff00000000);
      this_01 = (UtxoData *)((ulong)this_01 & 0xffffffff00000000);
      this_00 = (Script *)((ulong)this_00 & 0xffffffff00000000);
      local_15c4 = CfdAddTxInForEstimateFee
                             (in_stack_ffffffffffffe668,
                              (void *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                              in_stack_ffffffffffffe658,(uint32_t)((ulong)pSVar6 >> 0x20),
                              (char *)descriptor,(char *)asset,(bool)is_issuance,
                              (bool)is_blind_issuance,(bool)is_pegin,in_stack_ffffffffffffe6a8,
                              (char *)in_stack_ffffffffffffe6b0);
      std::__cxx11::string::~string((string *)&local_16a8);
      local_16bc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)handle_00,(char *)this_03,(CfdErrorCode *)lhs,(int *)this_01);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_16b8);
      if (!bVar1) {
        testing::Message::Message(&local_16c8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x307a12);
        testing::internal::AssertHelper::AssertHelper
                  (&local_16d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x85,pcVar2);
        testing::internal::AssertHelper::operator=(&local_16d0,&local_16c8);
        testing::internal::AssertHelper::~AssertHelper(&local_16d0);
        testing::Message::~Message((Message *)0x307a75);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x307aca);
      __gnu_cxx::
      __normal_iterator<cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
      ::operator++(&local_1678);
    }
    local_15c4 = CfdFinalizeEstimateFee
                           ((void *)CONCAT44(in_stack_ffffffffffffe90c,in_stack_ffffffffffffe908),
                            in_stack_ffffffffffffe900.ptr_,(char *)in_stack_ffffffffffffe8f8.data_,
                            (char *)in_stack_ffffffffffffe8f0.ptr_,in_stack_ffffffffffffe8e8,
                            in_stack_ffffffffffffe8e0,(bool)in_stack_ffffffffffffe8df,
                            (double)in_stack_ffffffffffffe8d0.data_);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)handle_00,(char *)this_03,(CfdErrorCode *)lhs,(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_16f0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xffffffffffffe900);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x307bdb);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffe8f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8b,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffe8f8,(Message *)&stack0xffffffffffffe900);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe8f8);
      testing::Message::~Message((Message *)0x307c3e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x307c93);
    testing::internal::EqHelper<false>::Compare<long,long>
              ((char *)handle_00,(char *)this_03,(long *)lhs,(long *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffe8e8);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xffffffffffffe8d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x307d3b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffe8d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8c,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffe8d0,(Message *)&stack0xffffffffffffe8d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe8d0);
      testing::Message::~Message((Message *)0x307d9e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x307df3);
    local_1748 = 0xe4c;
    testing::internal::EqHelper<false>::Compare<long,long>
              ((char *)handle_00,(char *)this_03,(long *)lhs,(long *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1740);
    if (!bVar1) {
      testing::Message::Message(&local_1750);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x307e9b);
      testing::internal::AssertHelper::AssertHelper
                (&local_1758,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1758,&local_1750);
      testing::internal::AssertHelper::~AssertHelper(&local_1758);
      testing::Message::~Message((Message *)0x307efe);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x307f56);
    in_stack_ffffffffffffe69c =
         CfdFreeEstimateFeeHandle
                   (in_stack_ffffffffffffe678,
                    (void *)CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670));
    local_176c = 0;
    local_15c4 = in_stack_ffffffffffffe69c;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)handle_00,(char *)this_03,(CfdErrorCode *)lhs,(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1768);
    in_stack_ffffffffffffe698 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffe698);
    if (!bVar1) {
      testing::Message::Message(&local_1778);
      in_stack_ffffffffffffe690 =
           (UtxoData *)testing::AssertionResult::failure_message((AssertionResult *)0x308029);
      testing::internal::AssertHelper::AssertHelper
                (&local_1780,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x90,(char *)in_stack_ffffffffffffe690);
      testing::internal::AssertHelper::operator=(&local_1780,&local_1778);
      testing::internal::AssertHelper::~AssertHelper(&local_1780);
      testing::Message::~Message((Message *)0x30808c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3080e1);
  }
  local_15c4 = CfdGetLastErrorCode((void *)CONCAT17(is_issuance,
                                                    CONCAT16(is_blind_issuance,
                                                             CONCAT15(is_pegin,uVar5))));
  if (local_15c4 != 0) {
    local_1788 = (char *)0x0;
    local_15c4 = CfdGetLastErrorMessage
                           ((void *)CONCAT44(in_stack_ffffffffffffe69c,in_stack_ffffffffffffe698),
                            (char **)in_stack_ffffffffffffe690);
    local_179c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)handle_00,(char *)this_03,(CfdErrorCode *)lhs,(int *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1798);
    if (!bVar1) {
      testing::Message::Message(&local_17a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3081f4);
      testing::internal::AssertHelper::AssertHelper
                (&local_17b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x97,pcVar2);
      testing::internal::AssertHelper::operator=(&local_17b0,&local_17a8);
      testing::internal::AssertHelper::~AssertHelper(&local_17b0);
      testing::Message::~Message((Message *)0x308257);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3082ac);
    testing::internal::CmpHelperSTREQ((internal *)&local_17c0,"\"\"","str_buffer","",local_1788);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_17c0);
    if (!bVar1) {
      testing::Message::Message(&local_17c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x308341);
      testing::internal::AssertHelper::AssertHelper
                (&local_17d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x98,pcVar2);
      testing::internal::AssertHelper::operator=(&local_17d0,&local_17c8);
      testing::internal::AssertHelper::~AssertHelper(&local_17d0);
      testing::Message::~Message((Message *)0x30839e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3083f3);
    CfdFreeStringBuffer((char *)lhs);
    local_1788 = (char *)0x0;
  }
  local_15c4 = CfdFreeHandle(lhs);
  local_17e4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)handle_00,(char *)this_03,(CfdErrorCode *)lhs,(int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_17e0);
  if (!bVar1) {
    testing::Message::Message(&local_17f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3084cf);
    testing::internal::AssertHelper::AssertHelper
              (&local_17f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17f8,&local_17f0);
    testing::internal::AssertHelper::~AssertHelper(&local_17f8);
    testing::Message::~Message((Message *)0x30852c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x308581);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_03);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x30859b);
  return;
}

Assistant:

TEST(cfdcapi_coin, EstimateFeeTest) {

  AddressFactory factory;
  std::vector<UtxoData> utxos = {
    UtxoData{
      static_cast<uint32_t>(12),
      BlockHash("590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"),
      Txid("ffe2f9aa4e2c2adb1676008aa07aec5f64149470abb5d89d91b26dfba14e9318"),
      static_cast<uint32_t>(0),
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(600000000),
      static_cast<AddressType>(0),
      nullptr,
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    },
    UtxoData{
      22,
      BlockHash("e05419389a3aa71017eb4dd1d9eec73500971b86aab2eb0db116707c7be67996"),
      Txid("d68154ae19408850308967b2cb1b84a92166829610fb2321548b655c4a747c79"),
      0,
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(700000000),
      static_cast<AddressType>(0),
#ifndef CFD_DISABLE_ELEMENTS
      nullptr,
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#else
      nullptr,
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    }
  };

  // 1 output data
  static const char* const kTxData = "02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fee_handle = nullptr;
  ret = CfdInitializeEstimateFee(handle, &fee_handle, false);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    for (auto& utxo : utxos) {
      ret = CfdAddTxInForEstimateFee(
          handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
          utxo.descriptor.c_str(), nullptr,
          false, false, false, 0, nullptr);
      //ret = CfdAddTxInputForEstimateFee(
      //    handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
      //    utxo.descriptor.c_str(), nullptr,
      //    false, false, false, nullptr, 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    int64_t tx_fee, utxo_fee;
    ret = CfdFinalizeEstimateFee(
        handle, fee_handle, kTxData, nullptr, &tx_fee, &utxo_fee, true, 20.0);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(static_cast<int64_t>(2820), tx_fee);
    EXPECT_EQ(static_cast<int64_t>(3660), utxo_fee);

    ret = CfdFreeEstimateFeeHandle(handle, fee_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}